

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

bool __thiscall QUndoStackPrivate::checkUndoLimit(QUndoStackPrivate *this)

{
  int iVar1;
  ulong uVar2;
  value_type pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  iVar6 = this->undo_limit;
  if (((long)iVar6 < 1) || ((this->macro_stack).d.size != 0)) {
    iVar5 = 0;
  }
  else {
    uVar2 = (this->command_list).d.size;
    iVar5 = 0;
    if ((ulong)(long)iVar6 < uVar2) {
      iVar6 = (int)uVar2 - iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
        pQVar3 = QList<QUndoCommand_*>::takeFirst(&this->command_list);
        if (pQVar3 != (value_type)0x0) {
          (*pQVar3->_vptr_QUndoCommand[1])(pQVar3);
        }
      }
      this->index = this->index - iVar6;
      iVar1 = this->clean_index;
      iVar5 = 1;
      if (iVar1 != -1) {
        iVar4 = -1;
        if (iVar6 <= iVar1) {
          iVar4 = iVar1 - iVar6;
        }
        this->clean_index = iVar4;
      }
    }
  }
  return SUB41(iVar5,0);
}

Assistant:

bool QUndoStackPrivate::checkUndoLimit()
{
    if (undo_limit <= 0 || !macro_stack.isEmpty() || undo_limit >= command_list.size())
        return false;

    int del_count = command_list.size() - undo_limit;

    for (int i = 0; i < del_count; ++i)
        delete command_list.takeFirst();

    index -= del_count;
    if (clean_index != -1) {
        if (clean_index < del_count)
            clean_index = -1; // we've deleted the clean command
        else
            clean_index -= del_count;
    }

    return true;
}